

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::anon_unknown_5::logAndSetResults
               (TestContext *testCtx,vector<unsigned_long,_std::allocator<unsigned_long>_> *r)

{
  int iVar1;
  double dVar2;
  deUint64 dVar3;
  pointer puVar4;
  TestLog *pTVar5;
  size_type sVar6;
  reference pvVar7;
  SampleBuilder *this;
  iterator __first;
  iterator __last;
  double *pdVar8;
  long lVar9;
  MessageBuilder *pMVar10;
  char *description;
  int precision;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  string local_428;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  MessageBuilder local_3e8;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  ScopedLogSection local_218;
  ScopedLogSection section;
  int resultNdx_2;
  int resultNdx_1;
  SampleBuilder local_1f8;
  int local_1d8;
  allocator<char> local_1d1;
  int resultNdx;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  LogValueInfo local_160;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_b9;
  string local_b8;
  LogSampleList local_98;
  double local_58;
  double deviation;
  deUint64 median;
  deUint64 average;
  deUint64 sum;
  vector<unsigned_long,_std::allocator<unsigned_long>_> resultsUs;
  TestLog *log;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *r_local;
  TestContext *testCtx_local;
  
  resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tcu::TestContext::getLog(testCtx);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,r);
  puVar4 = resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  average = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Result",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Result",&local_f1);
  tcu::LogSampleList::LogSampleList(&local_98,&local_b8,&local_f0);
  pTVar5 = tcu::TestLog::operator<<((TestLog *)puVar4,&local_98);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,(SampleInfoToken *)&tcu::TestLog::SampleInfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"Time",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"Time",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&resultNdx,"us",&local_1d1);
  tcu::LogValueInfo::LogValueInfo
            (&local_160,&local_180,&local_1a8,(string *)&resultNdx,QP_SAMPLE_VALUE_TAG_RESPONSE);
  pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_160);
  tcu::TestLog::operator<<(pTVar5,(EndSampleInfoToken *)&tcu::TestLog::EndSampleInfo);
  tcu::LogValueInfo::~LogValueInfo(&local_160);
  std::__cxx11::string::~string((string *)&resultNdx);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  tcu::LogSampleList::~LogSampleList(&local_98);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_1d8 = 0;
  while( true ) {
    iVar1 = local_1d8;
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
    if ((int)sVar6 <= iVar1) break;
    tcu::TestLog::operator<<
              (&local_1f8,
               (TestLog *)
               resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(BeginSampleToken *)&tcu::TestLog::Sample);
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
                        (long)local_1d8);
    this = tcu::SampleBuilder::operator<<(&local_1f8,*pvVar7);
    tcu::SampleBuilder::operator<<(this,(EndSampleToken *)&tcu::TestLog::EndSample);
    tcu::SampleBuilder::~SampleBuilder(&local_1f8);
    local_1d8 = local_1d8 + 1;
  }
  tcu::TestLog::operator<<
            ((TestLog *)
             resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (EndSampleListToken *)&tcu::TestLog::EndSampleList);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current);
  section.m_log._4_4_ = 0;
  while( true ) {
    iVar1 = section.m_log._4_4_;
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
    dVar3 = average;
    if ((int)sVar6 <= iVar1) break;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
                        (long)section.m_log._4_4_);
    average = *pvVar7 + average;
    section.m_log._4_4_ = section.m_log._4_4_ + 1;
  }
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
  median = dVar3 / sVar6;
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
  pdVar8 = (double *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,sVar6 >> 1);
  deviation = *pdVar8;
  local_58 = 0.0;
  section.m_log._0_4_ = 0;
  while( true ) {
    iVar1 = (int)section.m_log;
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
    dVar2 = local_58;
    if ((int)sVar6 <= iVar1) break;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
                        (long)(int)section.m_log);
    lVar9 = *pvVar7 - median;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
                        (long)(int)section.m_log);
    lVar9 = lVar9 * (*pvVar7 - median);
    auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = 0x45300000;
    local_58 = (auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0) + local_58;
    section.m_log._0_4_ = (int)section.m_log + 1;
  }
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
  auVar17._8_4_ = (int)(sVar6 >> 0x20);
  auVar17._0_8_ = sVar6;
  auVar17._12_4_ = 0x45300000;
  local_58 = sqrt(dVar2 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)));
  puVar4 = resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"Statistics from results",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"Statistics from results",&local_261);
  tcu::ScopedLogSection::ScopedLogSection(&local_218,(TestLog *)puVar4,&local_238,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  tcu::TestLog::operator<<
            (&local_3e8,
             (TestLog *)
             resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_3e8,(char (*) [10])"Average: ");
  auVar13._8_4_ = (int)(median >> 0x20);
  auVar13._0_8_ = median;
  auVar13._12_4_ = 0x45300000;
  local_3f0 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)median) - 4503599627370496.0)) / 1000.0;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_3f0);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])"ms\n");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [21])0x2b9b0be);
  local_3f8 = local_58 / 1000.0;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_3f8);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])"ms\n");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [25])0x2b9b0d7);
  dVar2 = local_58;
  sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
  auVar14._8_4_ = (int)(sVar6 >> 0x20);
  auVar14._0_8_ = sVar6;
  auVar14._12_4_ = 0x45300000;
  dVar11 = sqrt((auVar14._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0));
  local_400 = (dVar2 / dVar11) / 1000.0;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_400);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])"ms\n");
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [9])"Median: ");
  auVar15._8_4_ = (int)((ulong)deviation >> 0x20);
  auVar15._0_8_ = deviation;
  auVar15._12_4_ = 0x45300000;
  local_408 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,SUB84(deviation,0)) - 4503599627370496.0)) / 1000.0;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_408);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])"ms\n");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3e8);
  tcu::ScopedLogSection::~ScopedLogSection(&local_218);
  auVar16._8_4_ = (int)(median >> 0x20);
  auVar16._0_8_ = median;
  auVar16._12_4_ = 0x45300000;
  de::floatToString_abi_cxx11_
            (&local_428,(de *)0x2,
             (float)(((auVar16._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)median) - 4503599627370496.0)) / 1000.0),
             precision);
  description = (char *)std::__cxx11::string::c_str();
  tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_PASS,description);
  std::__cxx11::string::~string((string *)&local_428);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
  return;
}

Assistant:

void logAndSetResults (tcu::TestContext& testCtx, const vector<deUint64>& r)
{
	TestLog& log		= testCtx.getLog();
	vector<deUint64>	resultsUs = r;
	deUint64			sum = 0;
	deUint64			average;
	deUint64			median;
	double				deviation;

	log << TestLog::SampleList("Result", "Result")
		<< TestLog::SampleInfo << TestLog::ValueInfo("Time", "Time", "us", QP_SAMPLE_VALUE_TAG_RESPONSE)
		<< TestLog::EndSampleInfo;

	for (int resultNdx = 0; resultNdx < (int)resultsUs.size(); resultNdx++)
		log << TestLog::Sample << deInt64(resultsUs[resultNdx]) << TestLog::EndSample;

	log << TestLog::EndSampleList;

	std::sort(resultsUs.begin(), resultsUs.end());

	for (int resultNdx = 0; resultNdx < (int)resultsUs.size(); resultNdx++)
		sum += resultsUs[resultNdx];

	average	= sum / resultsUs.size();
	median	= resultsUs[resultsUs.size() / 2];

	deviation = 0.0;
	for (int resultNdx = 0; resultNdx < (int)resultsUs.size(); resultNdx++)
		deviation += (double)((resultsUs[resultNdx] - average) * (resultsUs[resultNdx] - average));

	deviation = std::sqrt(deviation/(double)resultsUs.size());

	{
		tcu::ScopedLogSection	section(log, "Statistics from results", "Statistics from results");

		log << TestLog::Message
		<< "Average: "					<< ((double)average/1000.0)											<< "ms\n"
		<< "Standard deviation: "		<< ((double)deviation/1000.0)										<< "ms\n"
		<< "Standard error of mean: "	<< (((double)deviation/std::sqrt((double)resultsUs.size()))/1000.0)	<< "ms\n"
		<< "Median: "					<< ((double)median/1000.0)											<< "ms\n"
		<< TestLog::EndMessage;
	}

	testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)((double)average/1000.0), 2).c_str());
}